

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

Vec_Ptr_t *
findNextLevelDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesInstance,
          antecedentConsequentVectorsStruct *anteConsecInstance,Vec_Ptr_t *previousMonotoneVectors)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar2;
  antecedentConsequentVectorsStruct *anteConseVectors;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *vDiffVector;
  Vec_Int_t *vUnionPrevMonotoneVector;
  antecedentConsequentVectorsStruct *anteConsecInstanceLocal;
  int local_50;
  int iElem;
  int j;
  int i;
  Vec_Int_t *newDisjunction;
  Vec_Int_t *vNewDisjunctVector;
  Vec_Int_t *vElem;
  Vec_Ptr_t *newLevelPtrVec;
  Vec_Ptr_t *previousMonotoneVectors_local;
  antecedentConsequentVectorsStruct *anteConsecInstance_local;
  aigPoIndices *aigPoIndicesInstance_local;
  Aig_Man_t *pAig_local;
  
  p = Vec_PtrAlloc(0);
  p_00 = Vec_IntAlloc(0);
  for (iElem = 0; iVar1 = Vec_PtrSize(previousMonotoneVectors), iElem < iVar1; iElem = iElem + 1) {
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(previousMonotoneVectors,iElem);
    for (local_50 = 0; iVar1 = Vec_IntSize(pVVar2), local_50 < iVar1; local_50 = local_50 + 1) {
      iVar1 = Vec_IntEntry(pVVar2,local_50);
      Vec_IntPushUniqueLocal(p_00,iVar1);
    }
  }
  iElem = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(previousMonotoneVectors);
    if (iVar1 <= iElem) {
      Vec_IntFree(p_00);
      return p;
    }
    pVVar2 = (Vec_Int_t *)Vec_PtrEntry(previousMonotoneVectors,iElem);
    anteConseVectors = allocAntecedentConsequentVectorsStruct();
    pVVar3 = Vec_IntDup(pVVar2);
    anteConseVectors->attrAntecedents = pVVar3;
    pVVar3 = vectorDifference(anteConsecInstance->attrConsequentCandidates,p_00);
    anteConseVectors->attrConsequentCandidates = pVVar3;
    if (pVVar3 == (Vec_Int_t *)0x0) break;
    pVVar3 = findNewDisjunctiveMonotone(pAig,aigPoIndicesInstance,anteConseVectors);
    if (pVVar3 != (Vec_Int_t *)0x0) {
      for (local_50 = 0; iVar1 = Vec_IntSize(pVVar3), local_50 < iVar1; local_50 = local_50 + 1) {
        iVar1 = Vec_IntEntry(pVVar3,local_50);
        p_01 = Vec_IntDup(pVVar2);
        Vec_IntPush(p_01,iVar1);
        Vec_PtrPush(p,p_01);
      }
      Vec_IntFree(pVVar3);
    }
    deallocAntecedentConsequentVectorsStruct(anteConseVectors);
    iElem = iElem + 1;
  }
  __assert_fail("vDiffVector",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                ,0x1db,
                "Vec_Ptr_t *findNextLevelDisjunctiveMonotone(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, Vec_Ptr_t *)"
               );
}

Assistant:

Vec_Ptr_t *findNextLevelDisjunctiveMonotone( 
		Aig_Man_t *pAig, 
		struct aigPoIndices *aigPoIndicesInstance, 
		struct antecedentConsequentVectorsStruct *anteConsecInstance, 
		Vec_Ptr_t *previousMonotoneVectors )
{
	Vec_Ptr_t *newLevelPtrVec;
	Vec_Int_t *vElem, *vNewDisjunctVector, *newDisjunction;
	int i, j, iElem;
	struct antecedentConsequentVectorsStruct *anteConsecInstanceLocal;
	Vec_Int_t *vUnionPrevMonotoneVector, *vDiffVector;

	newLevelPtrVec = Vec_PtrAlloc(0);
	vUnionPrevMonotoneVector = Vec_IntAlloc(0);
	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
		Vec_IntForEachEntry( vElem, iElem, j )
			Vec_IntPushUniqueLocal( vUnionPrevMonotoneVector, iElem );

	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
	{
		anteConsecInstanceLocal = allocAntecedentConsequentVectorsStruct();

		anteConsecInstanceLocal->attrAntecedents = Vec_IntDup(vElem);	
		vDiffVector = vectorDifference( anteConsecInstance->attrConsequentCandidates, vUnionPrevMonotoneVector);
		anteConsecInstanceLocal->attrConsequentCandidates = vDiffVector;
		assert( vDiffVector );

		//printf("Calling target function %d\n", i);
		vNewDisjunctVector = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstanceLocal );

		if( vNewDisjunctVector )
		{
			Vec_IntForEachEntry(vNewDisjunctVector, iElem, j)
			{
				newDisjunction = Vec_IntDup(vElem);
				Vec_IntPush( newDisjunction, iElem );
				Vec_PtrPush( newLevelPtrVec, newDisjunction );
			}
			Vec_IntFree(vNewDisjunctVector);
		}
		deallocAntecedentConsequentVectorsStruct( anteConsecInstanceLocal );
	}

	Vec_IntFree(vUnionPrevMonotoneVector);

	return newLevelPtrVec;
}